

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_time.cc
# Opt level: O1

int OPENSSL_tm_to_posix(tm *tm,int64_t *out)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  
  uVar1 = (long)tm->tm_year + 0x76c;
  iVar8 = 0;
  iVar7 = 0;
  if (uVar1 < 10000) {
    uVar2 = tm->tm_mon;
    iVar7 = 0;
    if (((-1 < (int)uVar2) && (iVar3 = tm->tm_mday, iVar7 = iVar8, 0 < iVar3)) && (uVar2 < 0xc)) {
      iVar8 = 0x20;
      if ((0xad5U >> (uVar2 & 0x1f) & 1) == 0) {
        if ((0x528U >> (uVar2 & 0x1f) & 1) == 0) {
          uVar9 = uVar1 * -0x70a3d70a3d70a3d7;
          iVar8 = ((uVar9 >> 4 | uVar9 << 0x3c) < 0xa3d70a3d70a3d8 ||
                  0x28f5c28f5c28f5c < (uVar9 >> 2 | uVar9 << 0x3e) && ((long)tm->tm_year & 3U) == 0)
                  + 0x1d;
        }
        else {
          iVar8 = 0x1f;
        }
      }
      if (iVar3 < iVar8) {
        uVar4 = tm->tm_sec;
        if ((int)uVar4 < 0x3c) {
          uVar5 = tm->tm_min;
          if ((int)uVar5 < 0x3c) {
            uVar6 = tm->tm_hour;
            if (((int)uVar6 < 0x18) && (-1 < (int)(uVar5 | uVar6 | uVar4))) {
              lVar12 = uVar1 - ((int)uVar2 < 2);
              if (10000 < lVar12 + 1U) {
                __assert_fail("-1 <= year && year <= 9999",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/posix_time.cc"
                              ,0x61,
                              "int posix_time_from_utc(int64_t, int64_t, int64_t, int64_t, int64_t, int64_t, int64_t *)"
                             );
              }
              lVar11 = lVar12 + -399;
              if (-1 < lVar12) {
                lVar11 = lVar12;
              }
              lVar14 = (lVar11 / 400) * -400;
              uVar1 = lVar12 + lVar14;
              lVar13 = (long)(int)uVar2 + -2;
              if ((int)uVar2 < 2) {
                lVar13 = (long)(int)uVar2 + 10;
              }
              uVar9 = lVar12 + lVar14 + 3;
              if (-1 < (long)uVar1) {
                uVar9 = uVar1;
              }
              uVar10 = SUB168(SEXT816((long)uVar1) * SEXT816(0x5c28f5c28f5c28f5),8) - uVar1;
              *out = (long)(int)uVar5 * 0x3c + (long)(int)uVar6 * 0xe10 + (long)(int)uVar4 +
                     -0xe7926b380 +
                     ((lVar13 * 0x99 + 2) / 5 + (long)iVar3 + (lVar11 / 400) * 0x23ab1 +
                      uVar1 * 0x16d + (uVar9 >> 2) + ((uVar10 >> 6) - ((long)uVar10 >> 0x3f))) *
                     0x15180;
              iVar7 = 1;
            }
          }
        }
      }
    }
  }
  return iVar7;
}

Assistant:

int OPENSSL_tm_to_posix(const struct tm *tm, int64_t *out) {
  return posix_time_from_utc(tm->tm_year + INT64_C(1900),
                             tm->tm_mon + INT64_C(1), tm->tm_mday, tm->tm_hour,
                             tm->tm_min, tm->tm_sec, out);
}